

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::cpp::GetUtf8Suffix_abi_cxx11_
                   (FieldDescriptor *field,Options *options)

{
  Utf8CheckMode UVar1;
  string *in_RDI;
  FieldDescriptor *in_stack_ffffffffffffff98;
  allocator local_2e;
  allocator local_2d [20];
  allocator local_19 [25];
  
  UVar1 = GetUtf8CheckMode(in_stack_ffffffffffffff98,(Options *)0x435fff);
  if (UVar1 == STRICT) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"UTF8",local_19);
    std::allocator<char>::~allocator((allocator<char> *)local_19);
  }
  else if (UVar1 == VERIFY) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"UTF8Verify",local_2d);
    std::allocator<char>::~allocator((allocator<char> *)local_2d);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"",&local_2e);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e);
  }
  return in_RDI;
}

Assistant:

std::string GetUtf8Suffix(const FieldDescriptor* field,
                          const Options& options) {
  switch (GetUtf8CheckMode(field, options)) {
    case STRICT:
      return "UTF8";
    case VERIFY:
      return "UTF8Verify";
    case NONE:
    default:  // Some build configs warn on missing return without default.
      return "";
  }
}